

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tvrq_api.c
# Opt level: O2

int RqOutExecute(RqOutProgram *pcOutProgMem,size_t nSymSize,void *pcInterSymMem,void *pOutSymMem,
                size_t nOutSymMemSize)

{
  ulong uVar1;
  int j;
  int iVar2;
  int i;
  int rt;
  long lVar3;
  tuple local_78;
  m256v I;
  m256v O;
  
  uVar1 = (long)pcOutProgMem->nESI * nSymSize;
  if (uVar1 < nOutSymMemSize || uVar1 - nOutSymMemSize == 0) {
    m256v_make(&O,pcOutProgMem->nESI,(int)nSymSize,(uint8_t *)pOutSymMem);
    m256v_make(&I,(pcOutProgMem->params).L,(int)nSymSize,(uint8_t *)pcInterSymMem);
    for (lVar3 = 0; lVar3 < pcOutProgMem->nESI; lVar3 = lVar3 + 1) {
      tuple_generate_from_ESI(&local_78,(&pcOutProgMem[1].params.K)[lVar3],&pcOutProgMem->params);
      rt = (int)lVar3;
      m256v_copy_row(&I,local_78.b,&O,rt);
      for (iVar2 = 1; iVar2 < local_78.d; iVar2 = iVar2 + 1) {
        local_78.b = (local_78.a + local_78.b) % (pcOutProgMem->params).W;
        m256v_multadd_row(&I,local_78.b,'\x01',&O,rt);
      }
      for (; (pcOutProgMem->params).P <= local_78.b1;
          local_78.b1 = (local_78.b1 + local_78.a1) % (pcOutProgMem->params).P1) {
      }
      m256v_multadd_row(&I,local_78.b1 + (pcOutProgMem->params).W,'\x01',&O,rt);
      for (iVar2 = 1; iVar2 < local_78.d1; iVar2 = iVar2 + 1) {
        do {
          local_78.b1 = (local_78.b1 + local_78.a1) % (pcOutProgMem->params).P1;
        } while ((pcOutProgMem->params).P <= local_78.b1);
        m256v_multadd_row(&I,(pcOutProgMem->params).W + local_78.b1,'\x01',&O,rt);
      }
    }
    iVar2 = 0;
  }
  else {
    fprintf(_stderr,"Error:%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/api/tvrq_api.c",
            0x131,"Not enough space for generated symbols.");
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int RqOutExecute(const RqOutProgram* pcOutProgMem,
		 size_t nSymSize,
		 const void* pcInterSymMem,
		 void* pOutSymMem,
		 size_t nOutSymMemSize)
{
	/* Check memory limitations */
	if (nOutSymMemSize < pcOutProgMem->nESI * nSymSize) {
		errmsg("Not enough space for generated symbols.");
		return RQ_ERR_ENOMEM;
	}

	/* Create matrices */
	const parameters* P = &pcOutProgMem->params;
	m256v O = m256v_make(pcOutProgMem->nESI, nSymSize, pOutSymMem);
	m256v I = m256v_make(P->L, nSymSize, (void*)pcInterSymMem);

	/* Generate symbols */
	for (int i = 0; i < pcOutProgMem->nESI; ++i) {
		// Sect 5.3.5.3
		tuple T = tuple_generate_from_ESI(
				pcOutProgMem->ESIs[i], P);
		m256v_copy_row(&I, T.b, &O, i);
		for (int j = 1; j < T.d; ++j) {
			T.b = (T.b + T.a) % P->W;
			m256v_multadd_row(&I, T.b, 1, &O, i);
		}
		while (T.b1 >= P->P)
			T.b1 = (T.b1 + T.a1) % P->P1;
		m256v_multadd_row(&I, P->W + T.b1, 1, &O, i);
		for (int j = 1; j < T.d1; ++j) {
			do {
				T.b1 = (T.b1 + T.a1) % P->P1;
			} while(T.b1 >= P->P);
			m256v_multadd_row(&I, P->W + T.b1, 1, &O, i);
		}
	}

	return 0;
}